

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  char cVar3;
  float *pfVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 *in_RCX;
  long in_RSI;
  long in_RDI;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char sums8;
  float scale_out;
  float sumfp32;
  float scale_in;
  int wt;
  int val;
  int k;
  char *sptr;
  Mat m;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  char *outptr;
  int p;
  size_t out_elemsize;
  bool use_int8_requantize;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Mat *in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  Mat *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  float in_stack_fffffffffffffcf4;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  Mat *in_stack_fffffffffffffd00;
  Mat *in_stack_fffffffffffffd08;
  float local_284;
  float local_280;
  int local_274;
  Option *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  int iVar10;
  Mat *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  int iVar11;
  int local_208;
  int local_204;
  Mat local_200;
  float *local_1b8;
  int local_1ac;
  ulong local_1a8;
  byte local_19d;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  reference local_188;
  vector<int,_std::allocator<int>_> local_178;
  int local_160;
  int local_15c;
  int local_158;
  undefined4 local_154;
  Mat local_150;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_70;
  int local_6c;
  long local_68;
  int local_5c;
  int local_58;
  int local_54;
  undefined8 *local_50;
  int local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Mat *local_10;
  int local_8;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  
  local_54 = *(int *)(in_RSI + 0x2c);
  local_58 = *(int *)(in_RSI + 0x30);
  local_5c = *(int *)(in_RSI + 0x38);
  local_68 = *(long *)(in_RSI + 0x10);
  local_6c = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_70 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_50 = in_RCX;
  ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 in_stack_fffffffffffffcd8);
  if (local_68 != 1) {
    local_f8 = *local_50;
    local_e8 = *(undefined4 *)(local_50 + 2);
    uStack_e4 = *(undefined4 *)((long)local_50 + 0x14);
    uStack_e0 = *(undefined4 *)(local_50 + 3);
    uStack_dc = *(undefined4 *)((long)local_50 + 0x1c);
    local_d8 = local_50[4];
    uStack_d0 = local_50[5];
    local_c8 = local_50[6];
    uStack_c0 = local_50[7];
    uStack_f0 = local_50[2];
    quantize_to_int8((Mat *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                     in_stack_fffffffffffffde8,
                     (Mat *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8);
  }
  ncnn::Mat::Mat(&local_150);
  make_padding((Convolution *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8,
               (Mat *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (Option *)in_stack_fffffffffffffcd8);
  bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  if (bVar2) {
    local_30 = -100;
    local_154 = 1;
  }
  else {
    local_54 = local_150.w;
    local_58 = local_150.h;
    local_158 = (local_150.w - local_6c) / *(int *)(in_RDI + 0xe4) + 1;
    local_15c = (local_150.h - local_70) / *(int *)(in_RDI + 0xe8) + 1;
    local_160 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
    std::allocator<int>::allocator((allocator<int> *)0x19e84e);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00,
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    std::allocator<int>::~allocator((allocator<int> *)0x19e877);
    local_188 = std::vector<int,_std::allocator<int>_>::operator[](&local_178,0);
    local_18c = 0;
    local_190 = 0;
    local_194 = local_54 * *(int *)(in_RDI + 0xe0) -
                *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xdc);
    for (local_198 = 0; local_198 < *(int *)(in_RDI + 0xd8); local_198 = local_198 + 1) {
      for (local_19c = 0; local_19c < *(int *)(in_RDI + 0xd4); local_19c = local_19c + 1) {
        local_188[local_18c] = local_190;
        local_18c = local_18c + 1;
        local_190 = *(int *)(in_RDI + 0xdc) + local_190;
      }
      local_190 = local_194 + local_190;
    }
    local_19d = 100 < *(int *)(in_RDI + 0x108);
    local_1a8 = (ulong)(((byte)~local_19d & 1) * 3 + 1);
    ncnn::Mat::create(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,
                      (int)in_stack_fffffffffffffcf4,(size_t)in_stack_fffffffffffffce8,
                      (Allocator *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    if (bVar2) {
      local_30 = -100;
    }
    else {
      for (local_1ac = 0; local_1ac < *(int *)(in_RDI + 0xd0); local_1ac = local_1ac + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20)
                          );
        pfVar4 = (float *)ncnn::Mat::operator_cast_to_signed_char_(&local_200);
        ncnn::Mat::~Mat((Mat *)0x19eaec);
        local_1b8 = pfVar4;
        for (local_204 = 0; local_204 < local_15c; local_204 = local_204 + 1) {
          for (local_208 = 0; local_208 < local_158; local_208 = local_208 + 1) {
            iVar11 = 0;
            pcVar5 = ncnn::Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x160));
            pcVar5 = pcVar5 + local_160 * local_5c * local_1ac;
            for (iVar10 = 0; iVar10 < local_5c; iVar10 = iVar10 + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffffd08,
                                 (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
              pcVar6 = ncnn::Mat::row<signed_char>
                                 ((Mat *)&stack0xfffffffffffffd98,
                                  local_204 * *(int *)(in_RDI + 0xe8));
              for (local_274 = 0; local_274 < local_160; local_274 = local_274 + 1) {
                iVar11 = (int)pcVar6[(long)local_188[local_274] +
                                     (long)(local_208 * *(int *)(in_RDI + 0xe4))] *
                         (int)pcVar5[local_274] + iVar11;
              }
              pcVar5 = pcVar5 + local_160;
              ncnn::Mat::~Mat((Mat *)0x19ed23);
            }
            pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1f0),(long)local_1ac);
            if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
              pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x238),0);
              fVar1 = *pfVar4;
              pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1f0),(long)local_1ac);
              local_280 = 1.0 / (fVar1 * *pfVar4);
            }
            else {
              local_280 = 0.0;
            }
            local_284 = (float)iVar11 * local_280;
            if (*(int *)(in_RDI + 0x100) != 0) {
              in_stack_fffffffffffffd08 =
                   (Mat *)ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1a8),(long)local_1ac);
              local_284 = *(float *)&in_stack_fffffffffffffd08->data + local_284;
            }
            local_8 = *(int *)(in_RDI + 0x10c);
            local_10 = (Mat *)(in_RDI + 0x110);
            local_4 = local_284;
            in_stack_fffffffffffffd00 = (Mat *)(ulong)(local_8 - 1U);
            if (local_8 - 1U < 5 || local_8 == 6) {
              switch((long)&switchD_0019eebd::switchdataD_00954070 +
                     (long)(int)(&switchD_0019eebd::switchdataD_00954070)
                                [(long)in_stack_fffffffffffffd00]) {
              case 0x19eebf:
                dVar7 = std::fmax((double)(ulong)(uint)local_284,0.0);
                local_4 = SUB84(dVar7,0);
                break;
              case 0x19eede:
                pfVar4 = ncnn::Mat::operator[](local_10,0);
                local_14 = *pfVar4;
                if (local_4 <= 0.0) {
                  local_4 = local_4 * local_14;
                }
                break;
              case 0x19ef4a:
                pfVar4 = ncnn::Mat::operator[](local_10,0);
                local_18 = *pfVar4;
                pfVar4 = ncnn::Mat::operator[](local_10,1);
                local_1c = *pfVar4;
                if (local_4 < local_18) {
                  local_4 = local_18;
                }
                if (local_1c < local_4) {
                  local_4 = local_1c;
                }
                break;
              case 0x19efda:
                dVar7 = std::exp((double)(ulong)(uint)-local_284);
                local_4 = 1.0 / (SUB84(dVar7,0) + 1.0);
                break;
              case 0x19f01b:
                auVar8._0_8_ = std::exp((double)(ulong)(uint)local_284);
                auVar8._8_8_ = extraout_XMM0_Qb;
                auVar9._4_12_ = auVar8._4_12_;
                auVar9._0_4_ = SUB84(auVar8._0_8_,0) + 1.0;
                dVar7 = std::log(auVar9._0_8_);
                dVar7 = std::tanh(dVar7);
                local_4 = local_284 * SUB84(dVar7,0);
                break;
              case 0x19f069:
                pfVar4 = ncnn::Mat::operator[](local_10,0);
                local_20 = *pfVar4;
                pfVar4 = ncnn::Mat::operator[](local_10,1);
                local_24 = *pfVar4;
                local_28 = -local_24 / local_20;
                local_2c = 1.0 / local_20 + local_28;
                if (local_28 <= local_4) {
                  if (local_4 <= local_2c) {
                    local_4 = local_4 * (local_4 * local_20 + local_24);
                  }
                }
                else {
                  local_4 = 0.0;
                }
              }
            }
            in_stack_fffffffffffffcf4 = local_4;
            if ((local_19d & 1) == 0) {
              *local_1b8 = local_4;
              local_1b8 = local_1b8 + 1;
            }
            else {
              ncnn::Mat::operator[]((Mat *)(in_RDI + 0x280),0);
              cVar3 = float2int8(in_stack_fffffffffffffce0);
              *(char *)local_1b8 = cVar3;
              local_1b8 = (float *)((long)local_1b8 + 1);
            }
          }
        }
      }
      local_30 = 0;
    }
    local_154 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  }
  ncnn::Mat::~Mat((Mat *)0x19f2c2);
  ncnn::Mat::~Mat((Mat *)0x19f2cf);
  return local_30;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Convolution input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scales, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[space_ofs[k]];
                        int wt = kptr[k];
                        sum += val * wt;
                    }

                    kptr += maxk;
                }

                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                if (use_int8_requantize)
                {
                    // requantize
                    float scale_out = top_blob_int8_scales[0];
                    signed char sums8 = float2int8(sumfp32 * scale_out);
                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize
                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}